

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateSetIntegerProperty
               (HelicsFederate fed,int intProperty,int propVal,HelicsError *err)

{
  Federate *pFVar1;
  uint in_EDX;
  uint in_ESI;
  Federate *fedObj;
  HelicsError *in_stack_ffffffffffffffd8;
  HelicsFederate in_stack_ffffffffffffffe0;
  
  pFVar1 = getFed(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (pFVar1 != (Federate *)0x0) {
    (*pFVar1->_vptr_Federate[6])(pFVar1,(ulong)in_ESI,(ulong)in_EDX);
  }
  return;
}

Assistant:

void helicsFederateSetIntegerProperty(HelicsFederate fed, int intProperty, int propVal, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->setProperty(intProperty, propVal);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}